

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O2

void __thiscall
rsg::ComputeLessOrEqualRange::operator()
          (ComputeLessOrEqualRange *this,Random *rnd,bool dstMin,bool dstMax,float *aMin,float *aMax
          ,float *bMin,float *bMax)

{
  float aLen;
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = getQuantizedFloat(rnd,0.0,8.0,0.25);
  fVar2 = getQuantizedFloat(rnd,-4.0,4.0,0.25);
  fVar3 = fVar1 + fVar2;
  if (dstMax && !dstMin) {
    *aMin = fVar2;
    *aMax = fVar3;
  }
  else {
    fVar1 = getQuantizedFloat(rnd,0.0,8.0 - fVar1,0.25);
    if (dstMin && dstMax) {
      *aMax = fVar2;
      *aMin = fVar2 - fVar1;
    }
    else {
      *aMin = fVar3 + 0.25;
      *aMax = fVar3 + 0.25 + fVar1;
    }
  }
  *bMin = fVar2;
  *bMax = fVar3;
  return;
}

Assistant:

void ComputeLessOrEqualRange::operator () (de::Random& rnd, bool dstMin, bool dstMax, T& aMin, T& aMax, T& bMin, T& bMax) const
{
	struct GetRandom
	{
		int		operator() (de::Random& random, int min, int max) const		{ return random.getInt(min, max); }
		float	operator() (de::Random& random, float min, float max) const	{ return getQuantizedFloat(random, min, max, getStep<float>()); }
	};

	// One random range
	T	rLen	= GetRandom()(rnd, T(0), T(8));
	T	rMin	= GetRandom()(rnd, T(-4), T(4));
	T	rMax	= rMin+rLen;

	if (dstMin == false && dstMax == true)
	{
		// Both values are possible, use same range for both inputs
		aMin	= rMin;
		aMax	= rMax;
		bMin	= rMin;
		bMax	= rMax;
	}
	else if (dstMin == true && dstMax == true)
	{
		// Compute range that is less than or equal to rMin..rMax
		T aLen = GetRandom()(rnd, T(0), T(8)-rLen);

		aMax	= rMin;
		aMin	= aMax - aLen;

		bMin	= rMin;
		bMax	= rMax;
	}
	else
	{
		// Compute range that is greater than rMin..rMax
		T aLen = GetRandom()(rnd, T(0), T(8)-rLen);

		aMin	= rMax + getStep<T>();
		aMax	= aMin + aLen;

		bMin	= rMin;
		bMax	= rMax;
	}
}